

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O1

ppointer p_hash_table_lookup(PHashTable *table,pconstpointer key)

{
  PHashTableNode *pPVar1;
  
  if (table == (PHashTable *)0x0) {
    return (ppointer)0x0;
  }
  pPVar1 = (PHashTableNode *)
           (table->table + ((ulong)(long)((int)key + 0x25) % table->size & 0xffffffff));
  do {
    pPVar1 = pPVar1->next;
    if (pPVar1 == (PHashTableNode *)0x0) {
      pPVar1 = (PHashTableNode *)0x0;
      break;
    }
  } while (pPVar1->key != key);
  if (pPVar1 == (PHashTableNode *)0x0) {
    return (ppointer)0xffffffffffffffff;
  }
  return pPVar1->value;
}

Assistant:

P_LIB_API ppointer
p_hash_table_lookup (const PHashTable *table, pconstpointer key)
{
	PHashTableNode	*node;
	puint		hash;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	hash = pp_hash_table_calc_hash (key, table->size);

	return ((node = pp_hash_table_find_node (table, key, hash)) == NULL) ? (ppointer) (-1) : node->value;
}